

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

void cs::process_context::cleanup_context(void)

{
  while (*(long *)(current_process + 0x88) != *(long *)(current_process + 0x80)) {
    stack_type<cs_impl::any,_std::allocator>::pop_no_return
              ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
  }
  return;
}

Assistant:

void process_context::cleanup_context()
	{
		while (!current_process->stack.empty())
			current_process->stack.pop_no_return();
#ifdef CS_DEBUGGER
		while(!current_process->stack_backtrace.empty())
			current_process->stack_backtrace.pop_no_return();
#endif
	}